

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffcprw(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  int iVar3;
  uchar *values;
  int *piVar4;
  void *buffer;
  FITSfile *pFVar5;
  long lVar6;
  size_t sVar7;
  long *plVar8;
  char *err_message;
  long lVar9;
  long lVar10;
  int nInVarCols;
  LONGLONG innaxis1;
  int nOutVarCols;
  LONGLONG hrepeat;
  LONGLONG hoffset;
  LONGLONG outnaxis2;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  void *local_c8;
  int local_b4;
  int *local_b0;
  size_t local_a8;
  int local_9c;
  long local_98;
  LONGLONG local_90;
  size_t local_88;
  size_t local_80;
  long local_78;
  long local_70;
  LONGLONG local_68;
  long local_60;
  int *local_58;
  long local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  local_b4 = 0;
  local_9c = 0;
  local_88 = 0;
  local_68 = 0;
  if (0 < *status) {
    return *status;
  }
  if (infptr->HDUposition == infptr->Fptr->curhdu) {
    if (infptr->Fptr->datastart == -1) {
      ffrdef(infptr,status);
    }
  }
  else {
    ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
  }
  if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
    if (outfptr->Fptr->datastart == -1) {
      ffrdef(outfptr,status);
    }
  }
  else {
    ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < *status) {
    return *status;
  }
  iVar3 = infptr->Fptr->hdutype;
  if ((iVar3 == 0) || (iVar2 = outfptr->Fptr->hdutype, iVar2 == 0)) {
    ffpmsg("Can not copy rows to or from IMAGE HDUs (ffcprw)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((iVar2 == 1 && iVar3 == 2) || (iVar2 == 2 && iVar3 == 1)) {
    ffpmsg("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
    *status = 0xe3;
    return 0xe3;
  }
  ffgkyjj(infptr,"NAXIS1",(LONGLONG *)&local_a8,(char *)0x0,status);
  ffgkyjj(infptr,"NAXIS2",&local_38,(char *)0x0,status);
  ffgkyjj(outfptr,"NAXIS1",(LONGLONG *)&local_40,(char *)0x0,status);
  ffgkyjj(outfptr,"NAXIS2",&local_60,(char *)0x0,status);
  if (0 < *status) {
    return *status;
  }
  if (local_40 != local_a8) {
    ffpmsg("Input and output tables do not have same width (ffcprw)");
    *status = 0xf1;
    return 0xf1;
  }
  if (local_38 < nrows + firstrow + -1) {
    ffpmsg("Not enough rows in input table to copy (ffcprw)");
    *status = 0x133;
    return 0x133;
  }
  iVar3 = infptr->Fptr->tfield;
  if (iVar3 != outfptr->Fptr->tfield) {
    ffpmsg("Input and output tables do not have same number of columns (ffcprw)");
    *status = 0x12e;
    return 0x12e;
  }
  values = (uchar *)malloc(local_40);
  if (values == (uchar *)0x0) {
    ffpmsg("Unable to allocate memory (ffcprw)");
    *status = 0x71;
    return 0x71;
  }
  sVar7 = (long)iVar3 << 2;
  local_b0 = (int *)malloc(sVar7);
  piVar4 = (int *)malloc(sVar7);
  fffvcl(infptr,&local_b4,local_b0,status);
  fffvcl(outfptr,&local_9c,piVar4,status);
  local_58 = piVar4;
  if (local_b4 != local_9c) {
LAB_00122be4:
    ffpmsg("Input and output tables have different variable columns (ffcprw)");
    *status = 0x12e;
    local_c8 = (void *)0x0;
    goto LAB_00122ccb;
  }
  if (0 < local_b4) {
    lVar6 = 0;
    do {
      if (local_b0[lVar6] != piVar4[lVar6]) goto LAB_00122be4;
      lVar6 = lVar6 + 1;
    } while (local_b4 != lVar6);
  }
  local_98 = nrows + firstrow;
  lVar6 = local_60 + 1;
  if (local_b4 == 0) {
    if (0 < nrows) {
      do {
        ffgtbb(infptr,firstrow,1,local_a8,values,status);
        ffptbb(outfptr,lVar6,1,local_a8,values,status);
        lVar6 = lVar6 + 1;
        firstrow = firstrow + 1;
      } while (firstrow < local_98);
    }
LAB_00122c7a:
    local_c8 = (void *)0x0;
  }
  else {
    ffirow(outfptr,local_60,nrows,status);
    if (nrows < 1) goto LAB_00122c7a;
    local_c8 = (void *)0x0;
    local_80 = 0;
    do {
      ffgtbb(infptr,firstrow,1,local_a8,values,status);
      local_90 = lVar6;
      ffptbb(outfptr,lVar6,1,local_a8,values,status);
      pFVar5 = infptr->Fptr;
      lVar10 = local_98;
      if (0 < pFVar5->tfield) {
        plVar8 = &pFVar5->tableptr->twidth;
        lVar6 = 0;
        lVar9 = 0;
        piVar4 = local_b0;
        do {
          if (lVar9 < local_b4) {
            iVar3 = piVar4[lVar9];
            lVar6 = lVar6 + 1;
            if (lVar6 == iVar3) {
              local_78 = (long)iVar3;
              local_50 = lVar9;
              local_48 = lVar6;
              ffgdesll(infptr,iVar3,firstrow,(LONGLONG *)&local_88,&local_68,status);
              sVar7 = local_88;
              if (*(int *)(plVar8 + -9) != -0x10) {
                if (*(int *)(plVar8 + -9) == -1) {
                  lVar6 = local_88 + 0xe;
                  if (-1 < (long)(local_88 + 7)) {
                    lVar6 = local_88 + 7;
                  }
                  sVar7 = lVar6 >> 3;
                }
                else {
                  sVar7 = local_88 * *plVar8;
                }
              }
              pFVar5 = outfptr->Fptr;
              local_70 = pFVar5->heapstart + pFVar5->datastart + pFVar5->heapsize;
              ffmbyt(infptr,infptr->Fptr->heapstart + infptr->Fptr->datastart + local_68,0,status);
              pFVar5 = outfptr->Fptr;
              if (pFVar5->lasthdu == 0) {
                if (((long)(local_70 + sVar7) <= pFVar5->headstart[(long)pFVar5->curhdu + 1]) ||
                   (iVar3 = ffiblk(outfptr,(long)(local_70 + sVar7 +
                                                 ~pFVar5->headstart[(long)pFVar5->curhdu + 1]) /
                                           0xb40 + 1,1,status), iVar3 < 1)) goto LAB_00122abb;
                err_message = "Failed to extend the size of the variable length heap (ffcprw)";
LAB_00122cbc:
                ffpmsg(err_message);
                goto LAB_00122ccb;
              }
LAB_00122abb:
              if (sVar7 != 0) {
                buffer = local_c8;
                if (((long)local_80 < (long)sVar7) &&
                   (buffer = realloc(local_c8,sVar7), local_80 = sVar7, buffer == (void *)0x0)) {
                  *status = 0x71;
                  err_message = "failed to allocate memory for variable column copy (ffcprw)";
                  goto LAB_00122cbc;
                }
                ffgbyt(infptr,sVar7,buffer,status);
                ffmbyt(outfptr,local_70,1,status);
                ffpbyt(outfptr,sVar7,buffer,status);
                local_c8 = buffer;
              }
              ffpdes(outfptr,(int)local_78,local_90,local_88,outfptr->Fptr->heapsize,status);
              pLVar1 = &outfptr->Fptr->heapsize;
              *pLVar1 = *pLVar1 + sVar7;
              lVar9 = local_50 + 1;
              pFVar5 = infptr->Fptr;
              piVar4 = local_b0;
              lVar6 = local_48;
              lVar10 = local_98;
            }
          }
          else {
            lVar6 = lVar6 + 1;
          }
          plVar8 = plVar8 + 0x14;
        } while (lVar6 < pFVar5->tfield);
      }
      lVar6 = local_90 + 1;
      firstrow = firstrow + 1;
    } while (firstrow < lVar10);
  }
  local_60 = local_60 + nrows;
  ffuky(outfptr,0x51,"NAXIS2",&local_60,(char *)0x0,status);
LAB_00122ccb:
  free(values);
  free(local_b0);
  free(local_58);
  if (local_c8 != (void *)0x0) {
    free(local_c8);
  }
  return *status;
}

Assistant:

int ffcprw(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
       ffirow(outfptr, outnaxis2, nrows, status);
       for (ii = firstrow; ii < firstrow + nrows; ii++)
       {
          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       for (ii = firstrow; ii < firstrow + nrows; ii++) {
           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
           jj++;
       }
    }
    outnaxis2 += nrows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}